

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int rsa_ssh1_public_blob_len(ptrlen data)

{
  mp_int *pmVar1;
  BinarySource src [1];
  BinarySource local_38;
  
  local_38.len = data.len;
  local_38.data = data.ptr;
  local_38.binarysource_ = &local_38;
  local_38.pos = 0;
  local_38.err = BSE_NO_ERROR;
  BinarySource_get_uint32(&local_38);
  pmVar1 = BinarySource_get_mp_ssh1(local_38.binarysource_);
  mp_free(pmVar1);
  pmVar1 = BinarySource_get_mp_ssh1(local_38.binarysource_);
  mp_free(pmVar1);
  return -(uint)((local_38.binarysource_)->err != BSE_NO_ERROR) | (uint)local_38.pos;
}

Assistant:

int rsa_ssh1_public_blob_len(ptrlen data)
{
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, data);

    /* Expect a length word, then exponent and modulus. (It doesn't
     * even matter which order.) */
    get_uint32(src);
    mp_free(get_mp_ssh1(src));
    mp_free(get_mp_ssh1(src));

    if (get_err(src))
        return -1;

    /* Return the number of bytes consumed. */
    return src->pos;
}